

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall
Manifold_PartialRevolveOnYAxis_Test::~Manifold_PartialRevolveOnYAxis_Test
          (Manifold_PartialRevolveOnYAxis_Test *this)

{
  Manifold_PartialRevolveOnYAxis_Test *this_local;
  
  ~Manifold_PartialRevolveOnYAxis_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Manifold, PartialRevolveOnYAxis) {
  Polygons polys = SquareHole(2.0);
  Polygons offsetPolys = SquareHole(10.0);

  Manifold revolute;
  for (size_t i = 0; i < polys[0].size(); i++) {
    Polygons rotatedPolys = RotatePolygons(polys, i);
    revolute = Manifold::Revolve(rotatedPolys, 48, 180);
    EXPECT_EQ(revolute.Genus(), 1);
    EXPECT_NEAR(revolute.Volume(), 24.0 * kPi, 1.0);
    EXPECT_NEAR(revolute.SurfaceArea(),
                48.0 * kPi + 4.0 * 4.0 * 2.0 - 2.0 * 2.0 * 2.0, 1.0);
  }
}